

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wycheproof_util.cc
# Opt level: O0

bool GetWycheproofResult(FileTest *t,WycheproofResult *out)

{
  size_t sVar1;
  bool bVar2;
  undefined8 uVar3;
  string *psVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  value_type local_118;
  long local_f8;
  size_t comma;
  size_t idx;
  string local_e0;
  string local_c0 [8];
  string flags;
  string local_98;
  undefined4 local_78;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string result;
  WycheproofResult *out_local;
  FileTest *t_local;
  
  result.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"result",&local_61);
  bVar2 = FileTest::GetAttribute(t,(string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"valid");
    if (bVar2) {
      *(undefined4 *)result.field_2._8_8_ = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"invalid");
      if (bVar2) {
        *(undefined4 *)result.field_2._8_8_ = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"acceptable");
        if (!bVar2) {
          uVar3 = std::__cxx11::string::c_str();
          FileTest::PrintLine(t,"Bad result string \'%s\'",uVar3);
          t_local._7_1_ = false;
          goto LAB_0067e35f;
        }
        *(undefined4 *)result.field_2._8_8_ = 2;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(result.field_2._8_8_ + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"flags",(allocator<char> *)(flags.field_2._M_local_buf + 0xf));
    bVar2 = FileTest::HasAttribute(t,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)(flags.field_2._M_local_buf + 0xf));
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"flags",(allocator<char> *)((long)&idx + 7));
      psVar4 = FileTest::GetAttributeOrDie(t,&local_e0);
      std::__cxx11::string::string(local_c0,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&idx + 7));
      comma = 0;
      while (sVar1 = comma, uVar5 = std::__cxx11::string::size(), sVar1 < uVar5) {
        local_f8 = std::__cxx11::string::find((char)local_c0,0x2c);
        if (local_f8 == -1) {
          local_f8 = std::__cxx11::string::size();
        }
        this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(result.field_2._8_8_ + 8);
        std::__cxx11::string::substr((ulong)&local_118,(ulong)local_c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        comma = local_f8 + 1;
      }
      std::__cxx11::string::~string(local_c0);
    }
    t_local._7_1_ = true;
  }
  else {
    t_local._7_1_ = false;
  }
LAB_0067e35f:
  local_78 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return t_local._7_1_;
}

Assistant:

bool GetWycheproofResult(FileTest *t, WycheproofResult *out) {
  std::string result;
  if (!t->GetAttribute(&result, "result")) {
    return false;
  }
  if (result == "valid") {
    out->raw_result = WycheproofRawResult::kValid;
  } else if (result == "invalid") {
    out->raw_result = WycheproofRawResult::kInvalid;
  } else if (result == "acceptable") {
    out->raw_result = WycheproofRawResult::kAcceptable;
  } else {
    t->PrintLine("Bad result string '%s'", result.c_str());
    return false;
  }

  out->flags.clear();
  if (t->HasAttribute("flags")) {
    std::string flags = t->GetAttributeOrDie("flags");
    size_t idx = 0;
    while (idx < flags.size()) {
      size_t comma = flags.find(',', idx);
      if (comma == std::string::npos) {
        comma = flags.size();
      }
      out->flags.push_back(flags.substr(idx, comma - idx));
      idx = comma + 1;
    }
  }
  return true;
}